

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  Location loc;
  undefined8 uVar1;
  undefined8 uVar2;
  size_type sVar3;
  Token *value;
  int iVar4;
  Token cur;
  Token local_d8;
  Token local_98;
  char *local_58;
  char *pcStack_50;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_48;
  undefined8 uStack_40;
  
  if ((this->tokens_).size_ <= n) {
    do {
      WastLexer::GetToken(&local_d8,this->lexer_);
      value = &local_d8;
      if (local_d8.token_type_ == LparAnn) {
        if ((this->options_->features).annotations_enabled_ == false) {
          local_48.offset = (size_t)local_d8.loc.field_1.field_1.offset;
          uStack_40 = local_d8.loc.field_1._8_8_;
          local_58 = (char *)local_d8.loc.filename._M_len;
          pcStack_50 = local_d8.loc.filename._M_str;
          Token::to_string_abi_cxx11_((string *)&local_98,&local_d8);
          Error(this,0x174183,(char *)local_98.loc.filename._M_len);
          if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_98.loc.filename._M_len !=
              &local_98.loc.field_1) {
            operator_delete((void *)local_98.loc.filename._M_len,
                            (long)local_98.loc.field_1.field_1.offset + 1);
          }
          loc.filename._M_str._0_4_ = (int)local_d8.loc.filename._M_str;
          loc.filename._M_len = local_d8.loc.filename._M_len;
          loc.filename._M_str._4_4_ = (int)((ulong)local_d8.loc.filename._M_str >> 0x20);
          loc.field_1.field_0.line = local_d8.loc.field_1._0_4_;
          loc.field_1.field_0.first_column = local_d8.loc.field_1._4_4_;
          loc.field_1.field_0.last_column = (int)local_d8.loc.field_1._8_8_;
          loc.field_1._12_4_ = (int)((ulong)local_d8.loc.field_1._8_8_ >> 0x20);
          Token::Token(&local_98,loc,First);
          value = &local_98;
          goto LAB_00134a5b;
        }
        if ((this->options_->features).code_metadata_enabled_ == true) {
          local_98.loc.filename._M_len = local_d8.field_2.text_._M_len;
          local_98.loc.filename._M_str = local_d8.field_2.text_._M_str;
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_98,
                             "metadata.code.",0,0xe);
          if (sVar3 == 0) goto LAB_00134a5b;
        }
        iVar4 = 1;
        uVar2 = local_d8._32_8_;
        do {
          local_d8._32_8_ = uVar2;
          WastLexer::GetToken(&local_98,this->lexer_);
          local_d8.loc.filename._M_len = local_98.loc.filename._M_len;
          local_d8.loc.filename._M_str = local_98.loc.filename._M_str;
          local_d8.loc.field_1.field_1.offset = local_98.loc.field_1.field_1.offset;
          local_d8.loc.field_1._8_8_ = local_98.loc.field_1._8_8_;
          uVar2._0_4_ = local_98.token_type_;
          uVar2._4_4_ = local_98._36_4_;
          local_d8.field_2.text_._M_len = local_98.field_2.text_._M_len;
          local_d8.field_2.text_._M_str = local_98.field_2.text_._M_str;
          local_d8.field_2.literal_.text._M_str = local_98.field_2.literal_.text._M_str;
          local_d8.token_type_ = local_98.token_type_;
          local_d8._36_4_ = local_98._36_4_;
          uVar1 = local_d8._32_8_;
          local_d8.token_type_ = local_98.token_type_;
          if (local_d8.token_type_ == LparAnn) {
LAB_001349ab:
            iVar4 = iVar4 + 1;
          }
          else if (local_d8.token_type_ == Rpar) {
            iVar4 = iVar4 + -1;
          }
          else if (local_d8.token_type_ == Lpar) goto LAB_001349ab;
          local_d8._32_8_ = uVar1;
        } while (0 < iVar4);
      }
      else {
LAB_00134a5b:
        CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,value);
      }
    } while ((this->tokens_).size_ <= n);
  }
  return *(TokenType *)
          ((long)&(this->tokens_).contents_._M_elems[0].token_type_ +
          (ulong)(((int)n + (int)(this->tokens_).front_ & 1U) << 6));
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken();
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar, unless it is
      // a code metadata annotation. In that case, we know how to parse it.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      if (options_->features.code_metadata_enabled() &&
          cur.text().find("metadata.code.") == 0) {
        tokens_.push_back(cur);
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken();
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}